

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_uu.c
# Opt level: O2

ssize_t uudecode_filter_read(archive_read_filter *self,void **buff)

{
  ssize_t request;
  byte *pbVar1;
  int iVar2;
  int iVar3;
  byte *b;
  size_t size;
  uint uVar4;
  long lVar5;
  long lVar6;
  char *fmt;
  uudecode *uudecode;
  long lVar7;
  byte bVar8;
  byte *pbVar9;
  archive_read *a;
  ulong uVar10;
  ulong uVar11;
  ssize_t sVar12;
  byte *pbVar13;
  byte *pbVar14;
  ssize_t avail_in;
  uudecode *local_58;
  long local_50;
  ssize_t local_48;
  void **local_40;
  ssize_t nl;
  
  local_58 = (uudecode *)self->data;
  local_40 = buff;
LAB_0013636b:
  b = (byte *)__archive_read_filter_ahead(self->upstream,1,&avail_in);
  uudecode = local_58;
  if (b == (byte *)0x0 && avail_in < 0) {
    return -0x1e;
  }
  if (b == (byte *)0x0) {
    avail_in = 0;
  }
  local_48 = avail_in;
  if (local_58->state != 4) {
    pbVar14 = local_58->out_buff;
    if ((long)local_58->in_cnt != 0) {
      iVar2 = ensure_in_buff_size(self,local_58,local_58->in_cnt + avail_in);
      if (iVar2 != 0) {
        return -0x1e;
      }
      memcpy(uudecode->in_buff + uudecode->in_cnt,b,avail_in);
      b = uudecode->in_buff;
      avail_in = uudecode->in_cnt + avail_in;
      uudecode->in_cnt = 0;
    }
    lVar5 = 0;
    lVar7 = 0;
    do {
      sVar12 = avail_in;
      if (avail_in - lVar5 == 0 || avail_in < lVar5) goto LAB_001368de;
      local_50 = lVar5;
      size = get_line(b,avail_in - lVar5,&nl);
      request = local_48;
      if ((long)size < 0) {
        if ((uudecode->state != 0) || ((uudecode->total < 1 && (lVar7 < 1)))) goto LAB_001368a0;
        uudecode->state = 4;
        lVar5 = sVar12;
        goto LAB_001368de;
      }
      iVar2 = uudecode->state;
      if (nl == 0) {
        if (iVar2 != 2) goto LAB_00136817;
LAB_001365af:
        if ((size - nl != 3) || (iVar2 = bcmp(b,"end ",3), iVar2 != 0)) {
LAB_001368a0:
          a = self->archive;
          fmt = "Insufficient compressed data";
          iVar2 = -1;
          goto LAB_001368b1;
        }
LAB_001365d9:
        iVar2 = 0;
LAB_001365db:
        uudecode->state = iVar2;
      }
      else {
        lVar6 = size * 2 + lVar7;
        lVar5 = local_50;
        if (iVar2 == 1) {
          if (lVar6 < 0x10001) {
            if ((""[*b] != '\0') && (0 < (long)(size - nl))) {
              uVar4 = *b & 0x3f;
              uVar10 = (ulong)uVar4 ^ 0x20;
              if (uVar10 < size - nl) {
                iVar2 = 2;
                if ((char)uVar4 != ' ') {
                  pbVar1 = b + 1;
                  while (pbVar13 = pbVar14, uVar11 = uVar10, pbVar9 = pbVar1, lVar5 = lVar7,
                        lVar7 = lVar5, pbVar14 = pbVar13, 0 < (long)uVar11) {
                    if ((""[*pbVar9] == '\0') || (""[pbVar9[1]] == '\0')) goto LAB_001368a0;
                    iVar2 = (pbVar9[1] & 0x3f ^ 0x20) << 0xc;
                    *pbVar13 = (byte)(((*pbVar9 ^ 0x20) << 0x12) >> 0x10) |
                               (byte)((uint)iVar2 >> 0x10);
                    lVar7 = lVar5 + 1;
                    pbVar1 = pbVar9 + 2;
                    uVar10 = 0;
                    pbVar14 = pbVar13 + 1;
                    if (uVar11 != 1) {
                      bVar8 = pbVar9[2];
                      if (""[bVar8] == '\0') goto LAB_001368a0;
                      iVar3 = (bVar8 & 0x3f ^ 0x20) << 6;
                      pbVar13[1] = (byte)((uint)iVar2 >> 8) | (byte)((uint)iVar3 >> 8);
                      lVar7 = lVar5 + 2;
                      pbVar1 = pbVar9 + 3;
                      uVar10 = 0;
                      pbVar14 = pbVar13 + 2;
                      if (uVar11 != 2) {
                        bVar8 = pbVar9[3];
                        if (""[bVar8] == '\0') goto LAB_001368a0;
                        pbVar13[2] = ((byte)iVar3 | bVar8 & 0x3f) ^ 0x20;
                        lVar7 = lVar5 + 3;
                        pbVar1 = pbVar9 + 4;
                        uVar10 = uVar11 - 3;
                        pbVar14 = pbVar13 + 3;
                      }
                    }
                  }
                  goto LAB_001365de;
                }
                goto LAB_001365db;
              }
            }
            goto LAB_001368a0;
          }
          goto LAB_001368de;
        }
        if (iVar2 == 2) goto LAB_001365af;
        if (iVar2 == 3) {
          if (0x10000 < lVar6) goto LAB_001368de;
          uVar10 = size - nl;
          pbVar1 = b;
          if ((((2 < (long)uVar10) && (*b == 0x3d)) && (b[1] == 0x3d)) && (b[2] == 0x3d))
          goto LAB_001365d9;
          while (pbVar13 = pbVar14, uVar11 = uVar10, pbVar9 = pbVar1, lVar5 = lVar7, lVar7 = lVar5,
                pbVar14 = pbVar13, 0 < (long)uVar11) {
            bVar8 = *pbVar9;
            if ((""[bVar8] == '\0') || (""[pbVar9[1]] == '\0')) goto LAB_001367f2;
            iVar2 = base64num[pbVar9[1]];
            *pbVar13 = (byte)((uint)(base64num[bVar8] << 0x12) >> 0x10) |
                       (byte)((uint)(iVar2 << 0xc) >> 0x10);
            lVar7 = lVar5 + 1;
            pbVar1 = pbVar9 + 2;
            uVar10 = uVar11 - 2;
            pbVar14 = pbVar13 + 1;
            if (2 < uVar11) {
              uVar10 = (ulong)pbVar9[2];
              if (uVar10 == 0x3d) goto LAB_001365de;
              if (""[uVar10] == '\0') goto LAB_001368a0;
              iVar3 = base64num[uVar10];
              pbVar13[1] = (byte)((uint)(iVar2 << 0xc) >> 8) | (byte)((uint)(iVar3 << 6) >> 8);
              lVar7 = lVar5 + 2;
              pbVar1 = pbVar9 + 3;
              uVar10 = 0;
              pbVar14 = pbVar13 + 2;
              if (uVar11 != 3) {
                uVar10 = (ulong)pbVar9[3];
                if (uVar10 == 0x3d) goto LAB_001365de;
                if (""[uVar10] == '\0') goto LAB_001368a0;
                pbVar13[2] = (byte)(iVar3 << 6) | (byte)base64num[uVar10];
                lVar7 = lVar5 + 3;
                pbVar1 = pbVar9 + 4;
                uVar10 = uVar11 - 4;
                pbVar14 = pbVar13 + 3;
              }
            }
          }
          if (uVar11 != 0) {
            bVar8 = *pbVar9;
LAB_001367f2:
            if (bVar8 != 0x3d) goto LAB_001368a0;
          }
        }
        else {
          if (0x1ffff < (long)(size + lVar7)) {
            a = self->archive;
            fmt = "Invalid format data";
            goto LAB_0013692d;
          }
          uVar10 = size - nl;
          if (10 < (long)uVar10) {
            lVar5 = 6;
            iVar2 = bcmp(b,"begin ",6);
            if (iVar2 == 0) {
LAB_0013679d:
              if ((((b[lVar5] & 0xf8) == 0x30) && ((b[lVar5 + 1] & 0xf8) == 0x30)) &&
                 (((b[lVar5 + 2] & 0xf8) == 0x30 && (b[lVar5 + 3] == 0x20)))) {
                iVar2 = (uint)(iVar2 != 0) * 2 + 1;
                uudecode = local_58;
                goto LAB_001365db;
              }
            }
            else if (0x11 < uVar10) {
              lVar5 = 0xd;
              iVar3 = bcmp(b,"begin-base64 ",0xd);
              if (iVar3 == 0) goto LAB_0013679d;
            }
          }
        }
      }
LAB_001365de:
      b = b + size;
      lVar5 = local_50 + size;
      uudecode = local_58;
    } while( true );
  }
  lVar7 = 0;
  lVar5 = avail_in;
  sVar12 = avail_in;
  goto LAB_001368de;
LAB_00136817:
  if (local_48 < 1 && lVar7 == 0) {
    a = self->archive;
    fmt = "Missing format data";
LAB_0013692d:
    iVar2 = 0x54;
LAB_001368b1:
    archive_set_error(&a->archive,iVar2,fmt);
  }
  else {
    iVar2 = ensure_in_buff_size(self,uudecode,size);
    if (iVar2 == 0) {
      if (uudecode->in_buff != b) {
        memmove(uudecode->in_buff,b,size);
      }
      local_58->in_cnt = (int)size;
      if (lVar7 != 0) {
        lVar5 = local_50 + size;
        sVar12 = avail_in;
LAB_001368de:
        lVar6 = 0;
        if (local_48 < sVar12) {
          lVar6 = local_48 - sVar12;
        }
        __archive_read_filter_consume(self->upstream,lVar6 + lVar5);
        *local_40 = local_58->out_buff;
        local_58->total = local_58->total + lVar7;
        return lVar7;
      }
      __archive_read_filter_consume(self->upstream,request);
      goto LAB_0013636b;
    }
  }
  return -0x1e;
}

Assistant:

static ssize_t
uudecode_filter_read(struct archive_read_filter *self, const void **buff)
{
	struct uudecode *uudecode;
	const unsigned char *b, *d;
	unsigned char *out;
	ssize_t avail_in, ravail;
	ssize_t used;
	ssize_t total;
	ssize_t len, llen, nl;

	uudecode = (struct uudecode *)self->data;

read_more:
	d = __archive_read_filter_ahead(self->upstream, 1, &avail_in);
	if (d == NULL && avail_in < 0)
		return (ARCHIVE_FATAL);
	/* Quiet a code analyzer; make sure avail_in must be zero
	 * when d is NULL. */
	if (d == NULL)
		avail_in = 0;
	used = 0;
	total = 0;
	out = uudecode->out_buff;
	ravail = avail_in;
	if (uudecode->state == ST_IGNORE) {
		used = avail_in;
		goto finish;
	}
	if (uudecode->in_cnt) {
		/*
		 * If there is remaining data which is saved by
		 * previous calling, use it first.
		 */
		if (ensure_in_buff_size(self, uudecode,
		    avail_in + uudecode->in_cnt) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		memcpy(uudecode->in_buff + uudecode->in_cnt,
		    d, avail_in);
		d = uudecode->in_buff;
		avail_in += uudecode->in_cnt;
		uudecode->in_cnt = 0;
	}
	for (;used < avail_in; d += llen, used += llen) {
		int64_t l, body;

		b = d;
		len = get_line(b, avail_in - used, &nl);
		if (len < 0) {
			/* Non-ascii character is found. */
			if (uudecode->state == ST_FIND_HEAD &&
			    (uudecode->total > 0 || total > 0)) {
				uudecode->state = ST_IGNORE;
				used = avail_in;
				goto finish;
			}
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "Insufficient compressed data");
			return (ARCHIVE_FATAL);
		}
		llen = len;
		if ((nl == 0) && (uudecode->state != ST_UUEND)) {
			if (total == 0 && ravail <= 0) {
				/* There is nothing more to read, fail */
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Missing format data");
				return (ARCHIVE_FATAL);
			}
			/*
			 * Save remaining data which does not contain
			 * NL('\n','\r').
			 */
			if (ensure_in_buff_size(self, uudecode, len)
			    != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			if (uudecode->in_buff != b)
				memmove(uudecode->in_buff, b, len);
			uudecode->in_cnt = (int)len;
			if (total == 0) {
				/* Do not return 0; it means end-of-file.
				 * We should try to read bytes more. */
				__archive_read_filter_consume(
				    self->upstream, ravail);
				goto read_more;
			}
			used += len;
			break;
		}
		switch (uudecode->state) {
		default:
		case ST_FIND_HEAD:
			/* Do not read more than UUENCODE_BID_MAX_READ bytes */
			if (total + len >= UUENCODE_BID_MAX_READ) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Invalid format data");
				return (ARCHIVE_FATAL);
			}
			if (len - nl >= 11 && memcmp(b, "begin ", 6) == 0)
				l = 6;
			else if (len - nl >= 18 &&
			    memcmp(b, "begin-base64 ", 13) == 0)
				l = 13;
			else
				l = 0;
			if (l != 0 && b[l] >= '0' && b[l] <= '7' &&
			    b[l+1] >= '0' && b[l+1] <= '7' &&
			    b[l+2] >= '0' && b[l+2] <= '7' && b[l+3] == ' ') {
				if (l == 6)
					uudecode->state = ST_READ_UU;
				else
					uudecode->state = ST_READ_BASE64;
			}
			break;
		case ST_READ_UU:
			if (total + len * 2 > OUT_BUFF_SIZE)
				goto finish;
			body = len - nl;
			if (!uuchar[*b] || body <= 0) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			/* Get length of undecoded bytes of current line. */
			l = UUDECODE(*b++);
			body--;
			if (l > body) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			if (l == 0) {
				uudecode->state = ST_UUEND;
				break;
			}
			while (l > 0) {
				int n = 0;

				if (!uuchar[b[0]] || !uuchar[b[1]])
					break;
				n = UUDECODE(*b++) << 18;
				n |= UUDECODE(*b++) << 12;
				*out++ = n >> 16; total++;
				--l;

				if (l > 0) {
					if (!uuchar[b[0]])
						break;
					n |= UUDECODE(*b++) << 6;
					*out++ = (n >> 8) & 0xFF; total++;
					--l;
				}
				if (l > 0) {
					if (!uuchar[b[0]])
						break;
					n |= UUDECODE(*b++);
					*out++ = n & 0xFF; total++;
					--l;
				}
			}
			if (l) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			break;
		case ST_UUEND:
			if (len - nl == 3 && memcmp(b, "end ", 3) == 0)
				uudecode->state = ST_FIND_HEAD;
			else {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			break;
		case ST_READ_BASE64:
			if (total + len * 2 > OUT_BUFF_SIZE)
				goto finish;
			l = len - nl;
			if (l >= 3 && b[0] == '=' && b[1] == '=' &&
			    b[2] == '=') {
				uudecode->state = ST_FIND_HEAD;
				break;
			}
			while (l > 0) {
				int n = 0;

				if (!base64[b[0]] || !base64[b[1]])
					break;
				n = base64num[*b++] << 18;
				n |= base64num[*b++] << 12;
				*out++ = n >> 16; total++;
				l -= 2;

				if (l > 0) {
					if (*b == '=')
						break;
					if (!base64[*b])
						break;
					n |= base64num[*b++] << 6;
					*out++ = (n >> 8) & 0xFF; total++;
					--l;
				}
				if (l > 0) {
					if (*b == '=')
						break;
					if (!base64[*b])
						break;
					n |= base64num[*b++];
					*out++ = n & 0xFF; total++;
					--l;
				}
			}
			if (l && *b != '=') {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			break;
		}
	}
finish:
	if (ravail < avail_in)
		used -= avail_in - ravail;
	__archive_read_filter_consume(self->upstream, used);

	*buff = uudecode->out_buff;
	uudecode->total += total;
	return (total);
}